

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  size_t *psVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *node;
  unsigned_long i;
  MemLeakPeriod period_local;
  MemoryLeakDetectorNode *leak_local;
  MemoryLeakDetectorTable *this_local;
  
  node = (MemoryLeakDetectorNode *)hash(this,leak->memory_);
  pMVar2 = MemoryLeakDetectorList::getNextLeak(this->table_ + (long)node,leak,period);
  while( true ) {
    if (pMVar2 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar2;
    }
    psVar1 = &node->size_;
    node = (MemoryLeakDetectorNode *)((long)psVar1 + 1);
    if ((MemoryLeakDetectorNode *)0x48 < node) break;
    pMVar2 = MemoryLeakDetectorList::getFirstLeak(this->table_ + (long)((long)psVar1 + 1),period);
  }
  return (MemoryLeakDetectorNode *)0x0;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}